

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_t2dec.c
# Opt level: O0

int jpc_dec_decodepkt(jpc_dec_t *dec,jas_stream_t *pkthdrstream,jas_stream_t *in,int compno,
                     int rlvlno,int prcno,int lyrno)

{
  jpc_dec_tile_t *pjVar1;
  jpc_dec_cp_t *pjVar2;
  jpc_dec_ccp_t *pjVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  jpc_ms_t *pjVar10;
  jpc_bitstream_t *bitstream;
  jpc_dec_rlvl_t *pjVar11;
  long lVar12;
  jpc_tagtreenode_t *pjVar13;
  ulong uVar14;
  jas_stream_t *pjVar15;
  uint local_104;
  uint local_100;
  uint local_fc;
  int hdroffend;
  int hdroffstart;
  int hdrlen;
  int maxpasses;
  int passno;
  _Bool discard;
  uint_fast32_t bodylen;
  int cblkno;
  int usedcblkcnt;
  jpc_dec_prc_t *prc;
  int bandno;
  jpc_dec_cp_t *cp;
  jpc_dec_ccp_t *ccp;
  jpc_dec_tile_t *tile;
  jpc_ms_t *ms;
  int mycounter;
  int savenumnewpasses;
  int present;
  int len;
  jpc_dec_seg_t *seg;
  int numnewpasses;
  int ret;
  int included;
  jpc_tagtreenode_t *leaf;
  int i;
  int m;
  int n;
  jpc_dec_cblk_t *cblk;
  jpc_dec_band_t *band;
  jpc_dec_rlvl_t *rlvl;
  jpc_dec_tcomp_t *tcomp;
  jpc_bitstream_t *inb;
  int prcno_local;
  int rlvlno_local;
  int compno_local;
  jas_stream_t *in_local;
  jas_stream_t *pkthdrstream_local;
  jpc_dec_t *dec_local;
  
  _passno = 0;
  bVar4 = dec->maxlyrs <= lyrno;
  pjVar1 = dec->curtile;
  pjVar2 = pjVar1->cp;
  pjVar3 = pjVar2->ccps;
  if (((pjVar2->csty & 2) != 0) && (lVar9 = jpc_dec_lookahead(in), lVar9 == 0xff91)) {
    pjVar10 = jpc_getms(in,dec->cstate);
    if (pjVar10 == (jpc_ms_t *)0x0) {
      return -1;
    }
    uVar5 = jpc_ms_gettype(pjVar10);
    if (uVar5 != 0xff91) {
      jpc_ms_destroy(pjVar10);
      jas_eprintf("missing SOP marker segment\n");
      return -1;
    }
    jpc_ms_destroy(pjVar10);
  }
  lVar9 = pkthdrstream->rwcnt_;
  bitstream = jpc_bitstream_sopen(pkthdrstream,"r");
  if (bitstream == (jpc_bitstream_t *)0x0) {
    dec_local._4_4_ = -1;
  }
  else {
    if ((bitstream->openmode_ & 1U) == 0) {
      __assert_fail("(inb)->openmode_ & JPC_BITSTREAM_READ",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t2dec.c"
                    ,0xdf,
                    "int jpc_dec_decodepkt(jpc_dec_t *, jas_stream_t *, jas_stream_t *, int, int, int, int)"
                   );
    }
    iVar6 = bitstream->cnt_ + -1;
    bitstream->cnt_ = iVar6;
    if (iVar6 < 0) {
      local_fc = jpc_bitstream_fillbuf(bitstream);
    }
    else {
      local_fc = (uint)(bitstream->buf_ >> ((byte)bitstream->cnt_ & 0x3f)) & 1;
    }
    if ((int)local_fc < 0) {
      jpc_bitstream_close(bitstream);
      dec_local._4_4_ = 1;
    }
    else {
      iVar6 = jas_getdbglevel();
      if (9 < iVar6) {
        jas_eprintf("\n",(ulong)local_fc);
      }
      iVar6 = jas_getdbglevel();
      if (9 < iVar6) {
        jas_eprintf("present=%d ",(ulong)local_fc);
      }
      if (local_fc == 0) {
        iVar6 = jpc_bitstream_inalign(bitstream,0x7f,0);
        if (iVar6 != 0) {
          jas_eprintf("alignment failed\n");
          jpc_bitstream_close(bitstream);
          return -1;
        }
      }
      else {
        pjVar11 = pjVar1->tcomps[compno].rlvls + rlvlno;
        _passno = 0;
        prc._4_4_ = 0;
        cblk = (jpc_dec_cblk_t *)pjVar11->bands;
        for (; prc._4_4_ < pjVar11->numbands; prc._4_4_ = prc._4_4_ + 1) {
          if (((cblk->segs).head != (jpc_dec_seg_t *)0x0) &&
             (lVar12 = *(long *)cblk + (long)prcno * 0x48, *(long *)(lVar12 + 0x30) != 0)) {
            bodylen._4_4_ = 0;
            bodylen._0_4_ = 0;
            _m = *(int **)(lVar12 + 0x30);
            for (; (int)bodylen < *(int *)(lVar12 + 0x28); bodylen._0_4_ = (int)bodylen + 1) {
              if (*_m == 0) {
                pjVar13 = jpc_tagtree_getleaf(*(jpc_tagtree_t **)(lVar12 + 0x38),bodylen._4_4_);
                numnewpasses = jpc_tagtree_decode(*(jpc_tagtree_t **)(lVar12 + 0x38),pjVar13,
                                                  lyrno + 1,bitstream);
                if (numnewpasses < 0) {
                  jpc_bitstream_close(bitstream);
                  return -1;
                }
              }
              else {
                if ((bitstream->openmode_ & 1U) == 0) {
                  __assert_fail("(inb)->openmode_ & JPC_BITSTREAM_READ",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t2dec.c"
                                ,0x100,
                                "int jpc_dec_decodepkt(jpc_dec_t *, jas_stream_t *, jas_stream_t *, int, int, int, int)"
                               );
                }
                iVar6 = bitstream->cnt_ + -1;
                bitstream->cnt_ = iVar6;
                if (iVar6 < 0) {
                  local_100 = jpc_bitstream_fillbuf(bitstream);
                }
                else {
                  local_100 = (uint)(bitstream->buf_ >> ((byte)bitstream->cnt_ & 0x3f)) & 1;
                }
                numnewpasses = local_100;
                if ((int)local_100 < 0) {
                  jpc_bitstream_close(bitstream);
                  return -1;
                }
              }
              iVar6 = jas_getdbglevel();
              if (9 < iVar6) {
                jas_eprintf("\n");
              }
              iVar6 = jas_getdbglevel();
              if (9 < iVar6) {
                jas_eprintf("included=%d ",(ulong)(uint)numnewpasses);
              }
              if (numnewpasses != 0) {
                if (*_m == 0) {
                  leaf._4_4_ = 1;
                  pjVar13 = jpc_tagtree_getleaf(*(jpc_tagtree_t **)(lVar12 + 0x40),bodylen._4_4_);
                  while( true ) {
                    iVar6 = jpc_tagtree_decode(*(jpc_tagtree_t **)(lVar12 + 0x40),pjVar13,leaf._4_4_
                                               ,bitstream);
                    if (iVar6 < 0) {
                      jpc_bitstream_close(bitstream);
                      return -1;
                    }
                    if (iVar6 != 0) break;
                    leaf._4_4_ = leaf._4_4_ + 1;
                  }
                  _m[8] = leaf._4_4_ + -1;
                  _m[10] = _m[8] * 3;
                }
                uVar5 = jpc_getnumnewpasses(bitstream);
                if ((int)uVar5 < 0) {
                  jpc_bitstream_close(bitstream);
                  return -1;
                }
                iVar6 = jas_getdbglevel();
                if (9 < iVar6) {
                  jas_eprintf("numnewpasses=%d ",(ulong)uVar5);
                }
                _present = *(jpc_dec_seg_t **)(_m + 6);
                ms._0_4_ = 0;
                if (0 < (int)uVar5) {
                  if (10000 < _m[10]) {
                    jpc_bitstream_close(bitstream);
                    return -1;
                  }
                  uVar7 = jpc_getcommacode(bitstream);
                  if ((int)uVar7 < 0) {
                    jpc_bitstream_close(bitstream);
                    return -1;
                  }
                  _m[9] = uVar7 + _m[9];
                  iVar6 = jas_getdbglevel();
                  seg._4_4_ = uVar5;
                  if (9 < iVar6) {
                    jas_eprintf("increment=%d ",(ulong)uVar7);
                  }
                  while (0 < (int)seg._4_4_) {
                    iVar6 = _m[10] + *_m + (int)ms;
                    local_104 = JPC_SEGPASSCNT(iVar6,_m[10],10000,
                                               (uint)((pjVar3[compno].cblkctx & 1) != 0),
                                               (uint)((pjVar3[compno].cblkctx & 4) != 0));
                    if ((!bVar4) && (_present == (jpc_dec_seg_t *)0x0)) {
                      _present = jpc_seg_alloc();
                      if (_present == (jpc_dec_seg_t *)0x0) {
                        jpc_bitstream_close(bitstream);
                        return -1;
                      }
                      jpc_seglist_insert((jpc_dec_seglist_t *)(_m + 2),*(jpc_dec_seg_t **)(_m + 4),
                                         _present);
                      if (*(long *)(_m + 6) == 0) {
                        *(jpc_dec_seg_t **)(_m + 6) = _present;
                      }
                      _present->passno = iVar6;
                      iVar6 = JPC_SEGTYPE(_present->passno,_m[10],
                                          (uint)((pjVar3[compno].cblkctx & 1) != 0));
                      _present->type = iVar6;
                      _present->maxpasses = local_104;
                    }
                    if ((int)seg._4_4_ < (int)local_104) {
                      local_104 = seg._4_4_;
                    }
                    ms._0_4_ = local_104 + (int)ms;
                    iVar6 = _m[9];
                    iVar8 = jpc_floorlog2(local_104);
                    uVar14 = jpc_bitstream_getbits(bitstream,iVar6 + iVar8);
                    iVar6 = (int)uVar14;
                    if (iVar6 < 0) {
                      jpc_bitstream_close(bitstream);
                      return -1;
                    }
                    iVar8 = jas_getdbglevel();
                    if (9 < iVar8) {
                      jas_eprintf("len=%d ",uVar14 & 0xffffffff);
                    }
                    if (!bVar4) {
                      _present->lyrno = lyrno;
                      _present->numpasses = local_104 + _present->numpasses;
                      _present->cnt = iVar6;
                      _present = _present->next;
                    }
                    _passno = iVar6 + _passno;
                    seg._4_4_ = seg._4_4_ - local_104;
                  }
                }
                *_m = uVar5 + *_m;
              }
              _m = _m + 0x14;
              bodylen._4_4_ = bodylen._4_4_ + 1;
            }
          }
          cblk = (jpc_dec_cblk_t *)&cblk->mqdec;
        }
        jpc_bitstream_inalign(bitstream,0,0);
      }
      jpc_bitstream_close(bitstream);
      lVar12 = pkthdrstream->rwcnt_;
      iVar6 = jas_getdbglevel();
      if (4 < iVar6) {
        jas_eprintf("hdrlen=%lu bodylen=%lu \n",(long)((int)lVar12 - (int)lVar9),_passno);
      }
      if (((pjVar2->csty & 4) != 0) && (lVar9 = jpc_dec_lookahead(pkthdrstream), lVar9 == 0xff92)) {
        pjVar10 = jpc_getms(pkthdrstream,dec->cstate);
        if (pjVar10 == (jpc_ms_t *)0x0) {
          jas_eprintf("cannot get (EPH) marker segment\n");
          return -1;
        }
        uVar5 = jpc_ms_gettype(pjVar10);
        if (uVar5 != 0xff92) {
          jpc_ms_destroy(pjVar10);
          jas_eprintf("missing EPH marker segment\n");
          return -1;
        }
        jpc_ms_destroy(pjVar10);
      }
      iVar6 = jas_getdbglevel();
      if (0 < iVar6) {
        jas_eprintf("packet body offset=%06ld\n");
      }
      if (bVar4) {
        iVar6 = jas_stream_gobble(in,(int)_passno);
        if (iVar6 != (int)_passno) {
          return -1;
        }
      }
      else {
        pjVar11 = pjVar1->tcomps[compno].rlvls + rlvlno;
        prc._4_4_ = 0;
        cblk = (jpc_dec_cblk_t *)pjVar11->bands;
        for (; prc._4_4_ < pjVar11->numbands; prc._4_4_ = prc._4_4_ + 1) {
          if (((cblk->segs).head != (jpc_dec_seg_t *)0x0) &&
             (lVar9 = *(long *)cblk + (long)prcno * 0x48, *(long *)(lVar9 + 0x30) != 0)) {
            bodylen._0_4_ = 0;
            _m = *(int **)(lVar9 + 0x30);
            for (; (int)bodylen < *(int *)(lVar9 + 0x28); bodylen._0_4_ = (int)bodylen + 1) {
              for (_present = *(jpc_dec_seg_t **)((long)_m + 0x18); _present != (jpc_dec_seg_t *)0x0
                  ; _present = _present->next) {
                if (*(long *)((long)_present + 0x20) == 0) {
                  pjVar15 = jas_stream_memopen((char *)0x0,0);
                  *(jas_stream_t **)((long)_present + 0x20) = pjVar15;
                  if (pjVar15 == (jas_stream_t *)0x0) {
                    return -1;
                  }
                }
                if (0 < *(int *)((long)_present + 0x28)) {
                  iVar6 = jpc_getdata(in,*(jas_stream_t **)((long)_present + 0x20),
                                      (long)*(int *)((long)_present + 0x28));
                  if (iVar6 < 0) {
                    return -1;
                  }
                  *(undefined4 *)((long)_present + 0x28) = 0;
                }
                if (*(int *)((long)_present + 0x18) <= *(int *)((long)_present + 0x14)) {
                  *(undefined8 *)((long)_m + 0x18) = _present->next;
                }
              }
              _m = (int *)((long)_m + 0x50);
            }
          }
          cblk = (jpc_dec_cblk_t *)&cblk->mqdec;
        }
      }
      dec_local._4_4_ = 0;
    }
  }
  return dec_local._4_4_;
}

Assistant:

static int jpc_dec_decodepkt(jpc_dec_t *dec, jas_stream_t *pkthdrstream, jas_stream_t *in, int compno, int rlvlno,
  int prcno, int lyrno)
{
	jpc_bitstream_t *inb;
	jpc_dec_tcomp_t *tcomp;
	jpc_dec_rlvl_t *rlvl;
	jpc_dec_band_t *band;
	jpc_dec_cblk_t *cblk;
	int n;
	int m;
	int i;
	jpc_tagtreenode_t *leaf;
	int included;
	int ret;
	int numnewpasses;
	jpc_dec_seg_t *seg;
	int len;
	int present;
	int savenumnewpasses;
	int mycounter;
	jpc_ms_t *ms;
	jpc_dec_tile_t *tile;
	jpc_dec_ccp_t *ccp;
	jpc_dec_cp_t *cp;
	int bandno;
	jpc_dec_prc_t *prc;
	int usedcblkcnt;
	int cblkno;
	uint_fast32_t bodylen;
	bool discard;
	int passno;
	int maxpasses;
	int hdrlen;
	int hdroffstart;
	int hdroffend;

	/* Avoid compiler warning about possible use of uninitialized
	  variable. */
	bodylen = 0;

	discard = (lyrno >= dec->maxlyrs);

	tile = dec->curtile;
	cp = tile->cp;
	ccp = &cp->ccps[compno];

	/*
	 * Decode the packet header.
	 */

	/* Decode the SOP marker segment if present. */
	if (cp->csty & JPC_COD_SOP) {
		if (jpc_dec_lookahead(in) == JPC_MS_SOP) {
			if (!(ms = jpc_getms(in, dec->cstate))) {
				return -1;
			}
			if (jpc_ms_gettype(ms) != JPC_MS_SOP) {
				jpc_ms_destroy(ms);
				jas_eprintf("missing SOP marker segment\n");
				return -1;
			}
			jpc_ms_destroy(ms);
		}
	}

hdroffstart = jas_stream_getrwcount(pkthdrstream);

	if (!(inb = jpc_bitstream_sopen(pkthdrstream, "r"))) {
		return -1;
	}

	if ((present = jpc_bitstream_getbit(inb)) < 0) {
		jpc_bitstream_close(inb);
		return 1;
	}
	JAS_DBGLOG(10, ("\n", present));
	JAS_DBGLOG(10, ("present=%d ", present));

	/* Is the packet non-empty? */
	if (present) {
		/* The packet is non-empty. */
		tcomp = &tile->tcomps[compno];
		rlvl = &tcomp->rlvls[rlvlno];
		bodylen = 0;
		for (bandno = 0, band = rlvl->bands; bandno < rlvl->numbands;
		  ++bandno, ++band) {
			if (!band->data) {
				continue;
			}
			prc = &band->prcs[prcno];
			if (!prc->cblks) {
				continue;
			}
			usedcblkcnt = 0;
			for (cblkno = 0, cblk = prc->cblks; cblkno < prc->numcblks;
			  ++cblkno, ++cblk) {
				++usedcblkcnt;
				if (!cblk->numpasses) {
					leaf = jpc_tagtree_getleaf(prc->incltagtree, usedcblkcnt - 1);
					if ((included = jpc_tagtree_decode(prc->incltagtree, leaf, lyrno + 1, inb)) < 0) {
						jpc_bitstream_close(inb);
						return -1;
					}
				} else {
					if ((included = jpc_bitstream_getbit(inb)) < 0) {
						jpc_bitstream_close(inb);
						return -1;
					}
				}
				JAS_DBGLOG(10, ("\n"));
				JAS_DBGLOG(10, ("included=%d ", included));
				if (!included) {
					continue;
				}
				if (!cblk->numpasses) {
					i = 1;
					leaf = jpc_tagtree_getleaf(prc->numimsbstagtree, usedcblkcnt - 1);
					for (;;) {
						if ((ret = jpc_tagtree_decode(prc->numimsbstagtree, leaf, i, inb)) < 0) {
							jpc_bitstream_close(inb);
							return -1;
						}
						if (ret) {
							break;
						}
						++i;
					}
					cblk->numimsbs = i - 1;
					cblk->firstpassno = cblk->numimsbs * 3;
				}
				if ((numnewpasses = jpc_getnumnewpasses(inb)) < 0) {
					jpc_bitstream_close(inb);
					return -1;
				}
				JAS_DBGLOG(10, ("numnewpasses=%d ", numnewpasses));
				seg = cblk->curseg;
				savenumnewpasses = numnewpasses;
				mycounter = 0;
				if (numnewpasses > 0) {
					if (cblk->firstpassno > 10000) {
						/* workaround for
						   CVE-2016-9398: this
						   large value would
						   make
						   JPC_SEGPASSCNT()
						   return a negative
						   value, causing an
						   assertion failure
						   in
						   jpc_floorlog2() */
						jpc_bitstream_close(inb);
						return -1;
					}
					if ((m = jpc_getcommacode(inb)) < 0) {
						jpc_bitstream_close(inb);
						return -1;
					}
					cblk->numlenbits += m;
					JAS_DBGLOG(10, ("increment=%d ", m));
					while (numnewpasses > 0) {
						passno = cblk->firstpassno + cblk->numpasses + mycounter;
	/* XXX - the maxpasses is not set precisely but this doesn't matter... */
						maxpasses = JPC_SEGPASSCNT(passno, cblk->firstpassno, 10000, (ccp->cblkctx & JPC_COX_LAZY) != 0, (ccp->cblkctx & JPC_COX_TERMALL) != 0);
						if (!discard && !seg) {
							if (!(seg = jpc_seg_alloc())) {
								jpc_bitstream_close(inb);
								return -1;
							}
							jpc_seglist_insert(&cblk->segs, cblk->segs.tail, seg);
							if (!cblk->curseg) {
								cblk->curseg = seg;
							}
							seg->passno = passno;
							seg->type = JPC_SEGTYPE(seg->passno, cblk->firstpassno, (ccp->cblkctx & JPC_COX_LAZY) != 0);
							seg->maxpasses = maxpasses;
						}
						n = JAS_MIN(numnewpasses, maxpasses);
						mycounter += n;
						numnewpasses -= n;
						if ((len = jpc_bitstream_getbits(inb, cblk->numlenbits + jpc_floorlog2(n))) < 0) {
							jpc_bitstream_close(inb);
							return -1;
						}
						JAS_DBGLOG(10, ("len=%d ", len));
						if (!discard) {
							seg->lyrno = lyrno;
							seg->numpasses += n;
							seg->cnt = len;
							seg = seg->next;
						}
						bodylen += len;
					}
				}
				cblk->numpasses += savenumnewpasses;
			}
		}

		jpc_bitstream_inalign(inb, 0, 0);

	} else {
		if (jpc_bitstream_inalign(inb, 0x7f, 0)) {
			jas_eprintf("alignment failed\n");
			jpc_bitstream_close(inb);
			return -1;
		}
	}
	jpc_bitstream_close(inb);

	hdroffend = jas_stream_getrwcount(pkthdrstream);
	hdrlen = hdroffend - hdroffstart;
	if (jas_getdbglevel() >= 5) {
		jas_eprintf("hdrlen=%lu bodylen=%lu \n", (unsigned long) hdrlen,
		  (unsigned long) bodylen);
	}

	if (cp->csty & JPC_COD_EPH) {
		if (jpc_dec_lookahead(pkthdrstream) == JPC_MS_EPH) {
			if (!(ms = jpc_getms(pkthdrstream, dec->cstate))) {
				jas_eprintf("cannot get (EPH) marker segment\n");
				return -1;
			}
			if (jpc_ms_gettype(ms) != JPC_MS_EPH) {
				jpc_ms_destroy(ms);
				jas_eprintf("missing EPH marker segment\n");
				return -1;
			}
			jpc_ms_destroy(ms);
		}
	}

	/* decode the packet body. */

	if (jas_getdbglevel() >= 1) {
		jas_eprintf("packet body offset=%06ld\n", (long) jas_stream_getrwcount(in));
	}

	if (!discard) {
		tcomp = &tile->tcomps[compno];
		rlvl = &tcomp->rlvls[rlvlno];
		for (bandno = 0, band = rlvl->bands; bandno < rlvl->numbands;
		  ++bandno, ++band) {
			if (!band->data) {
				continue;
			}
			prc = &band->prcs[prcno];
			if (!prc->cblks) {
				continue;
			}
			for (cblkno = 0, cblk = prc->cblks; cblkno < prc->numcblks;
			  ++cblkno, ++cblk) {
				seg = cblk->curseg;
				while (seg) {
					if (!seg->stream) {
						if (!(seg->stream = jas_stream_memopen(0, 0))) {
							return -1;
						}
					}
#if 0
jas_eprintf("lyrno=%02d, compno=%02d, lvlno=%02d, prcno=%02d, bandno=%02d, cblkno=%02d, passno=%02d numpasses=%02d cnt=%d numbps=%d, numimsbs=%d\n", lyrno, compno, rlvlno, prcno, band - rlvl->bands, cblk - prc->cblks, seg->passno, seg->numpasses, seg->cnt, band->numbps, cblk->numimsbs);
#endif
					if (seg->cnt > 0) {
						if (jpc_getdata(in, seg->stream, seg->cnt) < 0) {
							return -1;
						}
						seg->cnt = 0;
					}
					if (seg->numpasses >= seg->maxpasses) {
						cblk->curseg = seg->next;
					}
					seg = seg->next;
				}
			}
		}
	} else {
		if (jas_stream_gobble(in, bodylen) != JAS_CAST(int, bodylen)) {
			return -1;
		}
	}
	return 0;
}